

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ClassConfidenceThresholding::MergeFrom
          (ClassConfidenceThresholding *this,ClassConfidenceThresholding *from)

{
  LogMessage *other;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  ClassConfidenceThresholding *local_18;
  ClassConfidenceThresholding *from_local;
  ClassConfidenceThresholding *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/ClassConfidenceThresholding.pb.cc"
               ,0xbe);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::MergeFrom
            (&this->precisionrecallcurves_,&local_18->precisionrecallcurves_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ClassConfidenceThresholding::MergeFrom(const ClassConfidenceThresholding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ClassConfidenceThresholding)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  precisionrecallcurves_.MergeFrom(from.precisionrecallcurves_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}